

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise::forward_int8
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  undefined8 uVar5;
  pointer piVar6;
  char cVar7;
  int k_1;
  int iVar8;
  int iVar9;
  ulong uVar10;
  char cVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int j;
  int iVar17;
  int iVar18;
  long lVar19;
  size_type __n;
  int iVar20;
  long lVar21;
  long lVar22;
  int q;
  float *pfVar23;
  ulong uVar24;
  int j_1;
  ulong uVar25;
  float fVar26;
  float fVar27;
  long lStack_1d0;
  float *local_1c0;
  int local_198;
  Mat bottom_blob_int8_g;
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat bottom_blob_unbordered;
  
  iVar9 = bottom_blob->c;
  if (iVar9 % this->group != 0) {
    return -100;
  }
  if (this->num_output % this->group != 0) {
    return -100;
  }
  iVar17 = bottom_blob->w;
  iVar8 = bottom_blob->h;
  sVar3 = bottom_blob->elemsize;
  iVar1 = this->kernel_w;
  iVar2 = this->dilation_w;
  iVar12 = this->kernel_h;
  iVar13 = this->dilation_h;
  Mat::Mat(&bottom_blob_unbordered,bottom_blob);
  if (sVar3 != 1) {
    Mat::create(&bottom_blob_unbordered,iVar17,iVar8,iVar9,1,opt->workspace_allocator);
    local_198 = -100;
    if ((bottom_blob_unbordered.data == (void *)0x0) ||
       ((long)bottom_blob_unbordered.c * bottom_blob_unbordered.cstep == 0)) goto LAB_00149244;
    iVar17 = this->group;
    iVar8 = iVar9 / iVar17;
    iVar18 = 0;
    for (lVar21 = 0; lVar21 < iVar17; lVar21 = lVar21 + 1) {
      uVar5._0_1_ = opt->lightmode;
      uVar5._1_3_ = *(undefined3 *)&opt->field_0x1;
      uVar5._4_4_ = opt->num_threads;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = *(undefined4 *)&opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(1,(int)uVar5);
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)bottom_blob_unbordered.allocator;
      Mat::channel_range(&bottom_blob_bordered,bottom_blob,iVar18,iVar8);
      Mat::channel_range(&bottom_blob_int8_g,&bottom_blob_unbordered,iVar18,iVar8);
      quantize_float32_to_int8
                (&bottom_blob_bordered,&bottom_blob_int8_g,
                 *(float *)((long)(this->bottom_blob_int8_scales).data + lVar21 * 4),
                 (Option *)&_space_ofs);
      Mat::~Mat(&bottom_blob_int8_g);
      Mat::~Mat(&bottom_blob_bordered);
      iVar17 = this->group;
      iVar18 = iVar18 + iVar8;
    }
  }
  bottom_blob_bordered.elemsize._0_4_ = 0;
  bottom_blob_bordered.elemsize._4_4_ = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.c = 0;
  bottom_blob_bordered.cstep = 0;
  make_padding(this,&bottom_blob_unbordered,&bottom_blob_bordered,opt);
  local_198 = -100;
  if ((bottom_blob_bordered.data != (void *)0x0) &&
     ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
    iVar18 = bottom_blob_bordered.w;
    iVar1 = (~((iVar1 + -1) * iVar2) + bottom_blob_bordered.w) / this->stride_w;
    iVar2 = (~((iVar12 + -1) * iVar13) + bottom_blob_bordered.h) / this->stride_h;
    __n = (long)this->kernel_h * (long)this->kernel_w;
    std::vector<int,_std::allocator<int>_>::vector
              (&_space_ofs,__n,(allocator_type *)&bottom_blob_int8_g);
    piVar6 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar17 = this->dilation_h;
    iVar8 = this->kernel_w;
    iVar12 = this->dilation_w * iVar8;
    iVar20 = 0;
    lVar21 = 0;
    for (iVar13 = 0; iVar13 < this->kernel_h; iVar13 = iVar13 + 1) {
      for (lVar22 = 0; (int)lVar22 < iVar8; lVar22 = lVar22 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar21 + lVar22] = iVar20;
        iVar20 = iVar20 + this->dilation_w;
        iVar8 = this->kernel_w;
      }
      iVar20 = iVar20 + (iVar18 * iVar17 - iVar12);
      lVar21 = (int)lVar21 + lVar22;
    }
    Mat::create(top_blob,iVar1 + 1,iVar2 + 1,this->num_output,
                ((ulong)this->use_int8_requantize ^ 1) * 3 + 1,opt->blob_allocator);
    local_198 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar17 = this->group;
      iVar8 = (int)__n;
      if (iVar17 == this->num_output && iVar9 == iVar17) {
        uVar25 = 0;
        if (0 < iVar8) {
          uVar25 = __n & 0xffffffff;
        }
        local_1c0 = (float *)0x0;
        for (lVar21 = 0; lVar21 < iVar9; lVar21 = lVar21 + 1) {
          Mat::channel(&bottom_blob_int8_g,top_blob,(int)lVar21);
          pfVar23 = (float *)bottom_blob_int8_g.data;
          Mat::~Mat(&bottom_blob_int8_g);
          pvVar4 = (this->weight_data).data;
          bottom_blob_int8_g.elemsize =
               CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                        (undefined4)bottom_blob_bordered.elemsize);
          bottom_blob_int8_g.data =
               (void *)(bottom_blob_bordered.cstep * lVar21 * bottom_blob_int8_g.elemsize +
                       (long)bottom_blob_bordered.data);
          bottom_blob_int8_g.refcount = (int *)0x0;
          bottom_blob_int8_g.elempack = bottom_blob_bordered.elempack;
          bottom_blob_int8_g.allocator = bottom_blob_bordered.allocator;
          bottom_blob_int8_g.dims = 2;
          bottom_blob_int8_g.w = bottom_blob_bordered.w;
          bottom_blob_int8_g.h = bottom_blob_bordered.h;
          bottom_blob_int8_g.c = 1;
          bottom_blob_int8_g.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
          for (iVar9 = 0; iVar9 <= iVar2; iVar9 = iVar9 + 1) {
            for (iVar17 = 0; iVar17 <= iVar1; iVar17 = iVar17 + 1) {
              iVar8 = 0;
              for (uVar15 = 0; uVar25 != uVar15; uVar15 = uVar15 + 1) {
                iVar8 = iVar8 + (int)*(char *)((long)pvVar4 + uVar15 + (long)local_1c0) *
                                (int)*(char *)((long)bottom_blob_int8_g.data +
                                              (long)piVar6[uVar15] +
                                              (long)iVar17 * (long)this->stride_w +
                                              (long)bottom_blob_int8_g.w *
                                              (long)this->stride_h * (long)iVar9 *
                                              bottom_blob_int8_g.elemsize);
              }
              fVar26 = *(float *)((long)(this->weight_data_int8_scales).data + lVar21 * 4);
              if (this->use_int8_requantize == false) {
                fVar27 = 0.0;
                if (fVar26 != 0.0) {
                  fVar27 = 1.0 / (fVar26 * *(float *)((long)(this->bottom_blob_int8_scales).data +
                                                     lVar21 * 4));
                }
                fVar27 = (float)iVar8 * fVar27;
                if (this->bias_term != 0) {
                  fVar27 = fVar27 + *(float *)((long)(this->bias_data).data + lVar21 * 4);
                }
                fVar26 = 0.0;
                if (0.0 <= fVar27) {
                  fVar26 = fVar27;
                }
                if (this->activation_type != 1) {
                  fVar26 = fVar27;
                }
                *pfVar23 = fVar26;
                lVar22 = 4;
              }
              else {
                fVar27 = 0.0;
                if (fVar26 != 0.0) {
                  fVar27 = 1.0 / (fVar26 * *(float *)((long)(this->bottom_blob_int8_scales).data +
                                                     lVar21 * 4));
                }
                fVar27 = (float)iVar8 * fVar27;
                if (this->bias_term != 0) {
                  fVar27 = fVar27 + *(float *)((long)(this->bias_data).data + lVar21 * 4);
                }
                fVar26 = roundf(fVar27 * this->top_blob_int8_scale);
                iVar8 = (int)fVar26;
                if (iVar8 < -0x7e) {
                  iVar8 = -0x7f;
                }
                if (0x7e < iVar8) {
                  iVar8 = 0x7f;
                }
                cVar7 = (char)iVar8;
                cVar11 = '\0';
                if ('\0' < cVar7) {
                  cVar11 = cVar7;
                }
                if (this->activation_type != 1) {
                  cVar11 = cVar7;
                }
                *(char *)pfVar23 = cVar11;
                lVar22 = 1;
              }
              pfVar23 = (float *)((long)pfVar23 + lVar22);
            }
          }
          Mat::~Mat(&bottom_blob_int8_g);
          iVar9 = this->group;
          local_1c0 = (float *)((long)local_1c0 + __n);
        }
        local_198 = 0;
      }
      else {
        uVar25 = (long)this->num_output / (long)iVar17;
        iVar13 = (int)((long)iVar9 / (long)iVar17);
        iVar12 = (int)uVar25;
        local_198 = 0;
        uVar15 = 0;
        if (0 < iVar8) {
          uVar15 = __n & 0xffffffff;
        }
        uVar16 = 0;
        if (0 < iVar13) {
          uVar16 = (long)iVar9 / (long)iVar17 & 0xffffffff;
        }
        uVar14 = 0;
        if (0 < iVar12) {
          uVar14 = uVar25 & 0xffffffff;
        }
        for (lVar21 = 0; lVar21 < iVar17; lVar21 = lVar21 + 1) {
          for (uVar25 = 0; uVar25 != uVar14; uVar25 = uVar25 + 1) {
            lVar22 = uVar25 + lVar21 * iVar12;
            Mat::channel(&bottom_blob_int8_g,top_blob,(int)lVar22);
            local_1c0 = (float *)bottom_blob_int8_g.data;
            Mat::~Mat(&bottom_blob_int8_g);
            pvVar4 = (this->weight_data).data;
            for (iVar9 = 0; iVar9 <= iVar2; iVar9 = iVar9 + 1) {
              for (iVar17 = 0; iVar17 <= iVar1; iVar17 = iVar17 + 1) {
                iVar18 = 0;
                lVar19 = (long)pvVar4 +
                         uVar25 * (long)(iVar13 * iVar8) +
                         (long)(iVar12 * iVar13 * iVar8 * (int)lVar21);
                for (uVar24 = 0; uVar24 != uVar16; uVar24 = uVar24 + 1) {
                  bottom_blob_int8_g.elemsize =
                       CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                                (undefined4)bottom_blob_bordered.elemsize);
                  bottom_blob_int8_g.data =
                       (void *)((lVar21 * iVar13 + uVar24) * bottom_blob_bordered.cstep *
                                bottom_blob_int8_g.elemsize + (long)bottom_blob_bordered.data);
                  bottom_blob_int8_g.refcount = (int *)0x0;
                  bottom_blob_int8_g.elempack = bottom_blob_bordered.elempack;
                  bottom_blob_int8_g.allocator = bottom_blob_bordered.allocator;
                  bottom_blob_int8_g.dims = 2;
                  bottom_blob_int8_g.w = bottom_blob_bordered.w;
                  bottom_blob_int8_g.h = bottom_blob_bordered.h;
                  bottom_blob_int8_g.c = 1;
                  bottom_blob_int8_g.cstep =
                       (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
                  for (uVar10 = 0; uVar15 != uVar10; uVar10 = uVar10 + 1) {
                    iVar18 = iVar18 + (int)*(char *)(lVar19 + uVar10) *
                                      (int)*(char *)((long)bottom_blob_int8_g.data +
                                                    (long)piVar6[uVar10] +
                                                    (long)(bottom_blob_bordered.w * iVar9 *
                                                          this->stride_h) *
                                                    bottom_blob_int8_g.elemsize +
                                                    (long)iVar17 * (long)this->stride_w);
                  }
                  lVar19 = lVar19 + __n;
                  Mat::~Mat(&bottom_blob_int8_g);
                }
                fVar26 = *(float *)((long)(this->weight_data_int8_scales).data + lVar21 * 4);
                if (this->use_int8_requantize == false) {
                  fVar27 = 0.0;
                  if (fVar26 != 0.0) {
                    fVar27 = 1.0 / (fVar26 * *(float *)((long)(this->bottom_blob_int8_scales).data +
                                                       lVar21 * 4));
                  }
                  fVar27 = (float)iVar18 * fVar27;
                  if (this->bias_term != 0) {
                    fVar27 = fVar27 + *(float *)((long)(this->bias_data).data + lVar22 * 4);
                  }
                  fVar26 = 0.0;
                  if (0.0 <= fVar27) {
                    fVar26 = fVar27;
                  }
                  if (this->activation_type != 1) {
                    fVar26 = fVar27;
                  }
                  *local_1c0 = fVar26;
                  lStack_1d0 = 4;
                }
                else {
                  fVar27 = 0.0;
                  if (fVar26 != 0.0) {
                    fVar27 = 1.0 / (fVar26 * *(float *)((long)(this->bottom_blob_int8_scales).data +
                                                       lVar21 * 4));
                  }
                  fVar27 = (float)iVar18 * fVar27;
                  if (this->bias_term != 0) {
                    fVar27 = fVar27 + *(float *)((long)(this->bias_data).data + lVar22 * 4);
                  }
                  fVar26 = roundf(fVar27 * this->top_blob_int8_scale);
                  iVar18 = (int)fVar26;
                  if (iVar18 < -0x7e) {
                    iVar18 = -0x7f;
                  }
                  if (0x7e < iVar18) {
                    iVar18 = 0x7f;
                  }
                  cVar7 = (char)iVar18;
                  cVar11 = '\0';
                  if ('\0' < cVar7) {
                    cVar11 = cVar7;
                  }
                  if (this->activation_type != 1) {
                    cVar11 = cVar7;
                  }
                  *(char *)local_1c0 = cVar11;
                  lStack_1d0 = 1;
                }
                local_1c0 = (float *)((long)local_1c0 + lStack_1d0);
              }
            }
          }
          iVar17 = this->group;
        }
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  Mat::~Mat(&bottom_blob_bordered);
LAB_00149244:
  Mat::~Mat(&bottom_blob_unbordered);
  return local_198;
}

Assistant:

int ConvolutionDepthWise::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        bottom_blob_unbordered.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_unbordered.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_unbordered.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_unbordered.channel_range(channels_g * g, channels_g);

            quantize_float32_to_int8(bottom_blob_g, bottom_blob_int8_g, bottom_blob_int8_scales[g], opt_g);
        }
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            signed char* outptr = top_blob.channel(g);
            const signed char* kptr = (const signed char*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        signed char val = sptr[ space_ofs[k] ];
                        signed char w = kptr[k];
                        sum += val * w;
                    }

                    if (use_int8_requantize)
                    {
                        // requantize and relu
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g];

                        float scale_out = top_blob_int8_scale;//FIXME load param

                        signed char sums8 = float2int8(sumfp32 * scale_out);

                        if (activation_type == 1)
                        {
                            sums8 = std::max(sums8, (signed char)0);
                        }

                        outptr[0] = sums8;
                        outptr += 1;
                    }
                    else
                    {
                        // dequantize and relu
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g];

                        if (activation_type == 1)
                        {
                            sumfp32 = std::max(sumfp32, 0.f);
                        }

                        ((float*)outptr)[0] = sumfp32;
                        outptr += 4;
                    }
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g=0; g<group; g++)
        {
            for (int p=0; p<num_output_g; p++)
            {
                signed char* outptr = top_blob.channel(g * num_output_g + p);
                const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q=0; q<channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[ space_ofs[k] ];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        if (use_int8_requantize)
                        {
                            // requantize and relu
                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g * num_output_g + p];

                            float scale_out = top_blob_int8_scale;//FIXME load param

                            signed char sums8 = float2int8(sumfp32 * scale_out);

                            if (activation_type == 1)
                            {
                                sums8 = std::max(sums8, (signed char)0);
                            }

                            outptr[0] = sums8;
                            outptr += 1;
                        }
                        else
                        {
                            // dequantize and relu
                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g * num_output_g + p];

                            if (activation_type == 1)
                            {
                                sumfp32 = std::max(sumfp32, 0.f);
                            }

                            ((float*)outptr)[0] = sumfp32;
                            outptr += 4;
                        }
                    }
                }
            }
        }
    }

    return 0;
}